

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

int32_t __thiscall fasttext::FastText::getSubwordId(FastText *this,string *subword)

{
  uint uVar1;
  string_view str;
  uint32_t uVar2;
  int32_t iVar3;
  element_type *peVar4;
  element_type *this_00;
  string *in_RSI;
  int32_t h;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b86c1);
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  uVar2 = Dictionary::hash((Dictionary *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),str);
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b86fc);
  uVar1 = peVar4->bucket;
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b871d);
  iVar3 = Dictionary::nwords(this_00);
  return iVar3 + uVar2 % uVar1;
}

Assistant:

int32_t FastText::getSubwordId(const std::string& subword) const {
  int32_t h = dict_->hash(subword) % args_->bucket;
  return dict_->nwords() + h;
}